

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

bool __thiscall YAML::Emitter::SetMapFormat(Emitter *this,EMITTER_MANIP value)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = EmitterState::SetFlowType
                    ((this->m_pState)._M_t.
                     super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                     .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,Map,value,
                     Global);
  bVar2 = EmitterState::SetMapKeyFormat
                    ((this->m_pState)._M_t.
                     super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                     .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,value,Global);
  return bVar2 || bVar1;
}

Assistant:

bool Emitter::SetMapFormat(EMITTER_MANIP value) {
  bool ok = false;
  if (m_pState->SetFlowType(GroupType::Map, value, FmtScope::Global))
    ok = true;
  if (m_pState->SetMapKeyFormat(value, FmtScope::Global))
    ok = true;
  return ok;
}